

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_5.cpp
# Opt level: O1

int main(void)

{
  istream *this;
  ulong uVar1;
  long *plVar2;
  int *piVar3;
  int j;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int l;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int (*paiVar15) [55];
  int *piVar16;
  int m;
  int n;
  uint local_60;
  uint local_5c;
  int *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  this = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_5c);
  std::istream::operator>>(this,(int *)&local_60);
  if (0 < (int)local_5c) {
    paiVar15 = a;
    lVar11 = 0;
    do {
      if (0 < (int)local_60) {
        lVar13 = 0;
        piVar3 = *paiVar15;
        do {
          std::istream::operator>>((istream *)&std::cin,piVar3);
          lVar13 = lVar13 + 1;
          piVar3 = piVar3 + 1;
        } while (lVar13 < (int)local_60);
      }
      lVar11 = lVar11 + 1;
      paiVar15 = (int (*) [55])((long)paiVar15 + 0xdc);
    } while (lVar11 < (int)local_5c);
  }
  if ((int)local_5c < 1) {
    iVar6 = -0x3ed;
  }
  else {
    local_58 = a[0];
    local_50 = (ulong)local_60;
    local_48 = (ulong)local_5c;
    local_38 = (ulong)(local_5c + 1);
    iVar6 = -0x3ed;
    uVar1 = 0;
    uVar10 = 1;
    do {
      local_40 = uVar10;
      uVar4 = uVar1 & 0xffffffff;
      uVar10 = local_40;
      do {
        if (0 < (int)local_60) {
          uVar14 = 1;
          uVar12 = 0;
          piVar3 = local_58;
          do {
            lVar11 = 1;
            uVar7 = uVar12 & 0xffffffff;
            uVar5 = uVar14;
            do {
              iVar8 = 0;
              if ((uint)uVar1 <= (uint)uVar4) {
                iVar8 = 0;
                uVar9 = uVar1;
                piVar16 = piVar3;
                do {
                  if ((uint)uVar12 <= (uint)uVar7) {
                    lVar13 = 0;
                    do {
                      iVar8 = iVar8 + (*(int (*) [55])piVar16)[lVar13];
                      lVar13 = lVar13 + 1;
                    } while (lVar11 != lVar13);
                  }
                  uVar9 = uVar9 + 1;
                  piVar16 = (int *)((long)piVar16 + 0xdc);
                } while (uVar9 != uVar10);
              }
              if (iVar6 < iVar8) {
                iVar6 = iVar8;
              }
              uVar7 = (ulong)((uint)uVar7 + 1);
              uVar5 = uVar5 + 1;
              lVar11 = lVar11 + 1;
            } while (uVar5 != local_60 + 1);
            uVar12 = uVar12 + 1;
            uVar14 = uVar14 + 1;
            piVar3 = piVar3 + 1;
          } while (uVar12 != local_50);
        }
        uVar4 = (ulong)((uint)uVar4 + 1);
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_38);
      uVar1 = uVar1 + 1;
      local_58 = local_58 + 0x37;
      uVar10 = local_40 + 1;
    } while (uVar1 != local_48);
  }
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    int n,m,ans;                        //一共有n行，m列，ans用记录和的结果；
    cin >> n >> m;
    ans = -1005;                        //由于最后的结果可能
    for (int i = 0; i < n; ++i) {
        for (int j = 0; j <m; ++j) {
            cin >> a[i][j];
        }
    }
    for(int i = 0; i < n; i++)                                          //以下四个for循环实在暴力遍历找出所有的子矩阵
    {
        for (int j = i;j < n; j++)
        {
            for (int k = 0; k < m; ++k)
            {
                for (int l = k; l < m; ++l)
                {
                    //把子矩阵中所有元素加起来，
                    int temp = 0;   //暂时储存运算结果，来和ans比较，避免零矩阵的情况
                    for (int p = i; p <= j; p++)                        //i代表的是子矩阵行的起点，j代表的是子矩阵行的终点
                    {
                        for(int q = k; q <= l; q++)                     //k代表的是子矩阵列的起点，j代表的是子矩阵列的终点
                        {
                          temp += a[p][q];
                        }
                    }
                    //如果temp比ans的值大，就把结果赋给ans，
                    if(temp > ans)
                        ans = temp;
                }
            }
        }
    }
    cout << ans << endl;
    return 0;

}